

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_function::run_impl(statement_function *this)

{
  element_type *peVar1;
  var func;
  any local_30;
  types local_24;
  
  if (this->mIsMemFn == true) {
    peVar1 = (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_24 = member_fn;
    cs_impl::any::make_protect<cs::callable,cs::function&,cs::callable::types>
              (&local_30,&this->mFunc,&local_24);
    domain_manager::add_var_no_return<std::__cxx11::string&>
              (&(peVar1->super_runtime_type).storage,&this->mName,&local_30,this->mOverride);
  }
  else {
    cs_impl::any::make_protect<cs::callable,cs::function&>(&local_30,&this->mFunc);
    domain_manager::add_var_no_return<std::__cxx11::string&>
              (&(((((this->super_statement_base).context.
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage,&this->mName,&local_30,this->mOverride);
  }
  cs_impl::any::recycle(&local_30);
  return;
}

Assistant:

void statement_function::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (this->mIsMemFn)
			context->instance->storage.add_var_no_return(this->mName,
			        var::make_protect<callable>(this->mFunc, callable::types::member_fn),
			        mOverride);
		else {
			var func = var::make_protect<callable>(this->mFunc);
#ifdef CS_DEBUGGER
			if(context->instance->storage.is_initial())
				cs_debugger_func_breakpoint(this->mName, func);
#endif
			context->instance->storage.add_var_no_return(this->mName, func, mOverride);
		}
	}